

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_ddes_blend(REF_DBL mach,REF_DBL reynolds_number,REF_DBL sqrt_vel_grad_dot_grad,
                   REF_DBL distance,REF_DBL nu,REF_DBL *fd)

{
  double dVar1;
  REF_DBL RVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar1 = (mach * nu) / reynolds_number;
  dVar3 = sqrt_vel_grad_dot_grad * 0.41 * 0.41 * distance * distance;
  auVar4._0_8_ = dVar3 * 1e+20;
  auVar4._8_8_ = dVar1;
  auVar5._8_8_ = -dVar1;
  auVar5._0_8_ = -auVar4._0_8_;
  auVar5 = maxpd(auVar4,auVar5);
  RVar2 = 0.0;
  if (auVar5._8_8_ < auVar5._0_8_) {
    dVar1 = pow((dVar1 / dVar3) * 8.0,3.0);
    dVar1 = tanh(dVar1);
    RVar2 = 1.0 - dVar1;
  }
  *fd = RVar2;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_ddes_blend(REF_DBL mach, REF_DBL reynolds_number,
                                       REF_DBL sqrt_vel_grad_dot_grad,
                                       REF_DBL distance, REF_DBL nu,
                                       REF_DBL *fd) {
  REF_DBL rd;
  REF_DBL kappa = 0.41;
  REF_DBL num, denom;
  num = mach * nu / reynolds_number;
  denom = sqrt_vel_grad_dot_grad * kappa * kappa * distance * distance;
  if (ref_math_divisible(num, denom)) {
    rd = num / denom;
    *fd = 1.0 - tanh(pow(8.0 * rd, 3));
  } else {
    *fd = 0.0;
  };
  return REF_SUCCESS;
}